

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tt2ps.cpp
# Opt level: O3

void __thiscall ConstructCffPath::Line(ConstructCffPath *this,json *cubicContour,Point p1)

{
  int iVar1;
  int iVar2;
  reference pvVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  bool ret;
  Point p3;
  undefined1 local_78 [8];
  json_value local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_48;
  Point local_30;
  
  local_60 = p1.y;
  local_68 = p1.x;
  if (*this == (ConstructCffPath)0x1) {
    uVar4 = *(ulong *)(*(long *)(this + 8) + 0x28);
  }
  else {
    if (*this != (ConstructCffPath)0x2) goto LAB_00112c61;
    uVar4 = (*(long **)(this + 8))[1] - **(long **)(this + 8) >> 4;
  }
  if (1 < uVar4) {
    local_58 = local_60;
    local_48 = local_68;
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                           *)this,uVar4 - 2);
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)pvVar3,"on");
    nlohmann::detail::
    from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
              (pvVar3,(boolean_t *)local_78);
    if (local_78[0] == true) {
      pvVar3 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                             *)this,uVar4 - 1);
      Point::Point((Point *)local_78,pvVar3);
      pvVar3 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                             *)this,uVar4 - 2);
      Point::Point(&local_30,pvVar3);
      dVar5 = local_30.y - local_58;
      dVar6 = local_48 - local_30.x;
      iVar2 = (int)((double)CONCAT71(local_78._1_7_,local_78[0]) * dVar5 +
                    local_70.number_float * dVar6 + local_30.x * local_58 + -local_48 * local_30.y);
      iVar1 = -iVar2;
      if (0 < iVar2) {
        iVar1 = iVar2;
      }
      if ((double)iVar1 / SQRT(dVar5 * dVar5 + dVar6 * dVar6) < 1.0) {
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::erase((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)this,uVar4 - 1);
      }
    }
  }
LAB_00112c61:
  Point::ToJson_abi_cxx11_((Point *)local_78,SUB81(&local_68,0));
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               *)this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)local_78);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_78);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_78 + 8),local_78[0]);
  return;
}

Assistant:

void Line(json &cubicContour, Point p1)
{
	size_t length = cubicContour.size();
	if (length >= 2 && cubicContour[length - 2]["on"])
	{
		// 2 lines, merge if the are collinear.
		Point p2 = cubicContour[length - 1];
		Point p3 = cubicContour[length - 2];
		double a = p3.y - p1.y;
		double b = p1.x - p3.x;
		double c = p1.y * p3.x - p1.x * p3.y;
		double distance = abs(a * p2.x + b * p2.y + c) / sqrt(a * a + b * b);
		if (distance < 1)
			cubicContour.erase(length - 1);
	}
	cubicContour.push_back(p1.ToJson(true));
}